

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

int __thiscall TPZMatrix<long>::Subst_Forward(TPZMatrix<long> *this,TPZFMatrix<long> *B)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  int extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long local_38;
  
  lVar7 = (B->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow;
  iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])();
  iVar2 = 0;
  if ((lVar7 == CONCAT44(extraout_var,iVar1)) && ((this->super_TPZBaseMatrix).fDecomposed == '\x03')
     ) {
    iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
    iVar2 = 1;
    if (CONCAT44(extraout_var_00,iVar1) != 0 && -1 < extraout_var_00) {
      lVar7 = 0;
      do {
        iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (this,lVar7,lVar7);
        if (0 < (B->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol) {
          lVar5 = 0;
          do {
            if (lVar7 == 0) {
              lVar6 = 0;
            }
            else {
              lVar4 = 0;
              lVar6 = 0;
              do {
                iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                                  (this,lVar7,lVar4);
                iVar3 = (*(B->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable.
                          _vptr_TPZSavable[0x24])(B,lVar4,lVar5);
                lVar6 = lVar6 + CONCAT44(extraout_var_03,iVar3) * CONCAT44(extraout_var_02,iVar2);
                lVar4 = lVar4 + 1;
              } while (lVar7 != lVar4);
            }
            iVar2 = (*(B->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable.
                      _vptr_TPZSavable[0x24])(B,lVar7,lVar5);
            local_38 = (CONCAT44(extraout_var_04,iVar2) - lVar6) / CONCAT44(extraout_var_01,iVar1);
            (*(B->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x23]
            )(B,lVar7,lVar5,&local_38);
            lVar5 = lVar5 + 1;
          } while (lVar5 < (B->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol);
        }
        lVar7 = lVar7 + 1;
        iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
      } while (lVar7 < CONCAT44(extraout_var_05,iVar1));
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int TPZMatrix<TVar>::Subst_Forward( TPZFMatrix<TVar> *B ) const {
	if ( (B->Rows() != Dim()) || !fDecomposed || fDecomposed != ECholesky)
		return( 0 );
	for ( int64_t r = 0; r < Dim(); r++ ) {
		TVar pivot = GetVal( r, r );
		for ( int64_t c = 0; c < B->Cols();  c++ ) {
			// Faz sum = SOMA( A[r,i] * B[i,c] ); i = 0, ..., r-1.
			//
			TVar sum = 0.0;
			for ( int64_t i = 0; i < r; i++ ) sum += GetVal(r, i) * B->GetVal(i, c);
			
			// Faz B[r,c] = (B[r,c] - sum) / A[r,r].
			//
			B->PutVal( r, c, (B->GetVal(r, c) - sum) / pivot );
		}
	}
	return( 1 );
}